

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

int ovf::detail::parse::file_header(ovf_file *file)

{
  bool bVar1;
  exception ex;
  parse_error err;
  file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> local_80;
  
  tao::pegtl::internal::mmap_holder::mmap_holder<char_const*&>
            ((mmap_holder *)&local_80,&file->file_name);
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_end = local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
           super_mmap_holder.data.m_data +
           local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
           super_mmap_holder.data.m_size;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_begin = local_80.
             super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
             super_mmap_holder.data.m_data;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_current.data =
       local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
       super_mmap_holder.data.m_data;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_current.byte = 0;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_current.line = 1;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_current.byte_in_line = 0;
  local_80.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_source = local_80.
              super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
              super_mmap_holder.filename._M_dataplus._M_p;
  bVar1 = tao::pegtl::internal::
          rule_conjunction<tao::pegtl::internal::must<ovf::detail::parse::version>,_tao::pegtl::internal::must<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,_tao::pegtl::ascii::eol>_>_>,_tao::pegtl::internal::must<ovf::detail::parse::segment_count>_>
          ::
          match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_ovf::detail::parse::ovf_file_action,_tao::pegtl::normal,_tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>,_ovf_file_&>
                    (&local_80,file);
  tao::pegtl::internal::mmap_holder::~mmap_holder((mmap_holder *)&local_80);
  return -(uint)bVar1 | 0xfffffffd;
}

Assistant:

inline int file_header(ovf_file & file)
    try
    {
        pegtl::file_input<> in( file.file_name );
        bool success = pegtl::parse< ovf_file_header, ovf_file_action >( in, file );
        if( success )
            return OVF_OK;
        else
            return OVF_INVALID;
    }
    catch( pegtl::parse_error err )
    {
        file._state->message_latest = fmt::format(
            "libovf initial: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf initial: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        file._state->message_latest = "libovf initial: unknown exception";
        return OVF_ERROR;
    }